

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_extensions.cpp
# Opt level: O0

bool __thiscall
ONX_Model::ValdateComponentIdAndName
          (ONX_Model *this,Type component_type,ON_UUID *candidate_id,ON_UUID *component_parent_id,
          wchar_t *candidate_name,bool bResolveIdConflict,bool bResolveNameConflict,
          ON_UUID *model_id,ON_wString *model_name)

{
  uchar auVar1 [8];
  wchar_t *candidate_name_00;
  bool bVar2;
  bool bVar3;
  uint uVar4;
  wchar_t *suffix_separator;
  ON_UUID OVar5;
  undefined4 in_stack_fffffffffffffe7c;
  bool local_143;
  ON_UUID *local_140;
  byte local_126;
  byte local_125;
  ON_ComponentManifest local_e8;
  bool local_dd;
  bool bNameIsValid;
  int local_b4;
  undefined1 local_b0 [8];
  ON_NameHash name_hash;
  ON_UUID name_parent_id;
  bool bUniqueNameReqired;
  ON_wString local_60;
  ON_wString name;
  bool bCreateId;
  bool bIdAvailable;
  uint count;
  bool bIndexRequired;
  bool bResolveNameConflict_local;
  bool bResolveIdConflict_local;
  wchar_t *candidate_name_local;
  ON_UUID *component_parent_id_local;
  ON_UUID *candidate_id_local;
  Type component_type_local;
  ONX_Model *this_local;
  
  bVar2 = ON_ModelComponent::ComponentTypeIsValid(component_type);
  if (bVar2) {
    bVar2 = ON_ModelComponent::IndexRequired(component_type);
    uVar4 = ON_ComponentManifest::ComponentIndexLimit(&this->m_manifest,component_type);
    if ((bVar2) && (0x7ffffffe < uVar4)) {
      ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_extensions.cpp"
                 ,0x256,"","Unable to create model component index.");
    }
    else {
      name.m_s._4_4_ = candidate_id->Data1;
      unique0x00012004 = candidate_id->Data2;
      unique0x00012006 = candidate_id->Data3;
      bVar2 = ON_ComponentManifest::IdIsAvailable(&this->m_manifest,*candidate_id);
      bVar3 = ON_UuidIsNil(candidate_id);
      local_125 = 1;
      if (!bVar3) {
        local_126 = 0;
        if (!bVar2) {
          local_126 = bResolveIdConflict;
        }
        local_125 = local_126;
      }
      name.m_s._3_1_ = local_125 & 1;
      if ((bVar2) || (name.m_s._3_1_ != 0)) {
        ON_wString::ON_wString(&local_60,candidate_name);
        ON_wString::TrimLeftAndRight(&local_60,(wchar_t *)0x0);
        bVar2 = ON_ModelComponent::UniqueNameRequired(component_type);
        if (bVar2) {
          bVar2 = ON_ModelComponent::UniqueNameIncludesParent(component_type);
          local_140 = component_parent_id;
          if (!bVar2) {
            local_140 = &ON_nil_uuid;
          }
          name_hash.m_parent_id.Data4 = *(uchar (*) [8])local_140;
          ON_NameHash::Create((ON_NameHash *)local_b0,(ON_UUID *)name_hash.m_parent_id.Data4,
                              &local_60);
          bVar2 = ON_NameHash::IsInvalidNameHash((ON_NameHash *)local_b0);
          if (bVar2) {
            if (bResolveNameConflict) {
              ON_wString::operator=(&local_60,&ON_wString::EmptyString);
              ON_NameHash::Create((ON_NameHash *)&stack0xffffffffffffff24,
                                  (ON_UUID *)name_hash.m_parent_id.Data4,&local_60);
              memcpy(local_b0,&stack0xffffffffffffff24,0x28);
              goto LAB_005f445e;
            }
            ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_extensions.cpp"
                       ,0x26f,"","Invalid candidate_name parameter.");
            local_b4 = 2;
          }
          else {
LAB_005f445e:
            bVar2 = ON_wString::IsNotEmpty(&local_60);
            local_143 = false;
            if (bVar2) {
              local_143 = ON_ComponentManifest::NameIsAvailable
                                    (&this->m_manifest,component_type,(ON_NameHash *)local_b0);
            }
            local_dd = local_143;
            if (local_143 != false) goto LAB_005f4618;
            if (bResolveNameConflict) {
              auVar1 = *(uchar (*) [8])component_parent_id;
              candidate_name_00 = *(wchar_t **)component_parent_id->Data4;
              suffix_separator = ON_wString::operator_cast_to_wchar_t_(&local_60);
              OVar5._1_7_ = 0;
              OVar5.Data1._0_1_ = component_type;
              OVar5.Data4 = auVar1;
              ON_ComponentManifest::UnusedName
                        (&local_e8,(char)this - 0x30,OVar5,candidate_name_00,(wchar_t *)0x0,
                         suffix_separator,0,(uint *)CONCAT44(in_stack_fffffffffffffe7c,0xffffffff));
              ON_wString::operator=(&local_60,(ON_wString *)&local_e8);
              ON_wString::~ON_wString((ON_wString *)&local_e8);
              bVar2 = ON_wString::IsEmpty(&local_60);
              if (!bVar2) goto LAB_005f4618;
              ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_extensions.cpp"
                         ,0x283,"","Unable to create component name.");
              local_b4 = 2;
            }
            else {
              local_b4 = 2;
            }
          }
        }
        else {
LAB_005f4618:
          if ((name.m_s._3_1_ & 1) == 0) {
            OVar5 = *candidate_id;
          }
          else {
            OVar5 = ON_CreateId();
          }
          *model_id = OVar5;
          ON_wString::operator=(model_name,&local_60);
          this_local._7_1_ = 1;
          local_b4 = 1;
        }
        ON_wString::~ON_wString(&local_60);
        if (local_b4 == 1) goto LAB_005f46e5;
      }
    }
  }
  else {
    ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_extensions.cpp"
               ,0x24e,"","Invalid component_type parameter.");
  }
  model_id->Data1 = 0;
  model_id->Data2 = 0;
  model_id->Data3 = 0;
  model_id->Data4[0] = '\0';
  model_id->Data4[1] = '\0';
  model_id->Data4[2] = '\0';
  model_id->Data4[3] = '\0';
  model_id->Data4[4] = '\0';
  model_id->Data4[5] = '\0';
  model_id->Data4[6] = '\0';
  model_id->Data4[7] = '\0';
  ON_wString::operator=(model_name,&ON_wString::EmptyString);
  this_local._7_1_ = 0;
LAB_005f46e5:
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool ONX_Model::ValdateComponentIdAndName(
  ON_ModelComponent::Type component_type,
  const ON_UUID& candidate_id,
  const ON_UUID& component_parent_id,
  const wchar_t* candidate_name,
  bool bResolveIdConflict,
  bool bResolveNameConflict,
  ON_UUID& model_id,
  ON_wString& model_name
  ) const
{
  for (;;)
  {
    if (false == ON_ModelComponent::ComponentTypeIsValid(component_type))
    {
      ON_ERROR("Invalid component_type parameter.");
      break;
    }

    const bool bIndexRequired = ON_ModelComponent::IndexRequired(component_type);
    const unsigned int count = m_manifest.ComponentIndexLimit(component_type);
    if (bIndexRequired && count >= 0x7FFFFFFFU)
    {
      ON_ERROR("Unable to create model component index.");
      break;
    }
    
    const bool bIdAvailable = m_manifest.IdIsAvailable(candidate_id);
    const bool bCreateId = ON_UuidIsNil(candidate_id) || (false == bIdAvailable && bResolveIdConflict);
    if (false == bIdAvailable && false == bCreateId)
    {
      break;
    }

    ON_wString name(candidate_name);
    name.TrimLeftAndRight();
    const bool bUniqueNameReqired = ON_ModelComponent::UniqueNameRequired(component_type);
    if ( bUniqueNameReqired )
    {
      const ON_UUID name_parent_id
        = ON_ModelComponent::UniqueNameIncludesParent(component_type)
        ? component_parent_id
        : ON_nil_uuid;
      ON_NameHash name_hash = ON_NameHash::Create(name_parent_id, name);
      if (name_hash.IsInvalidNameHash())
      {
        if (false == bResolveNameConflict)
        {
          ON_ERROR("Invalid candidate_name parameter.");
          break;
        }
        name = ON_wString::EmptyString;
        name_hash = ON_NameHash::Create(name_parent_id, name);
      }

      const bool bNameIsValid = name.IsNotEmpty() && m_manifest.NameIsAvailable(component_type, name_hash);
      if (false == bNameIsValid )
      {
        // we need to create a unique and non-empty name
        if (false == bResolveNameConflict)
        {
          // not allowed to modify name
          break;
        }

        name = m_manifest.UnusedName(component_type, component_parent_id, nullptr, name, nullptr, ON_UNSET_UINT_INDEX, nullptr);
        if (name.IsEmpty())
        {
          ON_ERROR("Unable to create component name.");
          break;
        }
      }
    }

    model_id = bCreateId ? ON_CreateId() : candidate_id;
    model_name = name;
    return true;
  }

  model_id = ON_nil_uuid;
  model_name = ON_wString::EmptyString;
  return false;
}